

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::Storage::installCustomFormatSpecifier
          (Storage *this,CustomFormatSpecifier *customFormatSpecifier)

{
  bool bVar1;
  char *formatSpecifier;
  Mutex *pMVar2;
  NoScopedLock<el::base::threading::internal::NoMutex> local_20;
  ScopedLock scopedLock;
  CustomFormatSpecifier *customFormatSpecifier_local;
  Storage *this_local;
  
  scopedLock._vptr_NoScopedLock = (_func_int **)customFormatSpecifier;
  formatSpecifier = CustomFormatSpecifier::formatSpecifier(customFormatSpecifier);
  bVar1 = hasCustomFormatSpecifier(this,formatSpecifier);
  if (!bVar1) {
    pMVar2 = customFormatSpecifiersLock(this);
    threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
              (&local_20,pMVar2);
    utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
    push_back(&this->m_customFormatSpecifiers,(value_type *)scopedLock._vptr_NoScopedLock);
    threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
              (&local_20);
  }
  return;
}

Assistant:

void Storage::installCustomFormatSpecifier(const CustomFormatSpecifier& customFormatSpecifier) {
  if (hasCustomFormatSpecifier(customFormatSpecifier.formatSpecifier())) {
    return;
  }
  base::threading::ScopedLock scopedLock(customFormatSpecifiersLock());
  m_customFormatSpecifiers.push_back(customFormatSpecifier);
}